

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Clasp::SatReader::parseHeuristic(SatReader *this,uint32 maxVar,SharedContext *ctx)

{
  DomModType t;
  Literal LVar1;
  int iVar2;
  uint uVar3;
  Literal c;
  
  t.val_ = Potassco::ProgramReader::matchPos
                     (&this->super_ProgramReader,5,"heuristic: modifier expected");
  LVar1 = matchLit(this,maxVar);
  Potassco::ProgramReader::require
            (&this->super_ProgramReader,(LVar1.rep_ & 2) == 0,"heuristic: positive literal expected"
            );
  iVar2 = Potassco::ProgramReader::matchInt
                    (&this->super_ProgramReader,-0x8000,0x7fff,"heuristic: bias expected");
  uVar3 = Potassco::ProgramReader::matchPos
                    (&this->super_ProgramReader,0xffff,"heuristic: priority expected");
  c = matchLit(this,maxVar);
  DomainTable::add(&ctx->heuristic,LVar1.rep_ >> 2,t,(int16)iVar2,(uint16)uVar3,c);
  return;
}

Assistant:

void SatReader::parseHeuristic(uint32 maxVar, SharedContext& ctx) {
	using Potassco::Heuristic_t;
	Heuristic_t type = static_cast<Heuristic_t>(matchPos(Heuristic_t::eMax, "heuristic: modifier expected"));
	Literal atom = matchLit(maxVar);
	require(!atom.sign(), "heuristic: positive literal expected");
	int16    bias = (int16)matchInt(INT16_MIN, INT16_MAX, "heuristic: bias expected");
	uint16   prio = (uint16)matchPos(UINT16_MAX, "heuristic: priority expected");
	ctx.heuristic.add(atom.var(), type, bias, prio, matchLit(maxVar));
}